

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool adios2sys::SystemTools::TextFilesDiffer(string *path1,string *path2)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  bool hasData2;
  bool hasData1;
  string line2;
  string line1;
  ifstream if2;
  ifstream if1;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined5 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7d;
  _Ios_Openmode _Var5;
  undefined2 in_stack_fffffffffffffb84;
  undefined1 in_stack_fffffffffffffb86;
  byte in_stack_fffffffffffffb87;
  istream *in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  int local_438;
  long local_428 [65];
  long local_220 [67];
  byte local_1;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var5 = _S_in;
  std::ifstream::ifstream(local_220,pcVar4,_S_in);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_428,pcVar4,_Var5);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if (((bVar1 & 1) == 0) &&
     (bVar2 = std::ios::operator!((ios *)((long)local_428 + *(long *)(local_428[0] + -0x18))),
     (bVar2 & 1) == 0)) {
    while( true ) {
      __lhs = &local_458;
      std::__cxx11::string::string((string *)__lhs);
      std::__cxx11::string::string((string *)&stack0xfffffffffffffb88);
      in_stack_fffffffffffffb7d =
           GetLineFromStream(in_stack_fffffffffffffb88,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffb87,
                                      CONCAT16(in_stack_fffffffffffffb86,
                                               CONCAT24(in_stack_fffffffffffffb84,_Var5))),
                             (bool *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(
                                                  in_stack_fffffffffffffb7d,
                                                  in_stack_fffffffffffffb78))),(size_type)__lhs);
      in_stack_fffffffffffffb87 = in_stack_fffffffffffffb7d;
      in_stack_fffffffffffffb86 =
           GetLineFromStream(in_stack_fffffffffffffb88,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffb7d,
                                      CONCAT16(in_stack_fffffffffffffb86,
                                               CONCAT24(in_stack_fffffffffffffb84,_Var5))),
                             (bool *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(
                                                  in_stack_fffffffffffffb7d,
                                                  in_stack_fffffffffffffb78))),(size_type)__lhs);
      in_stack_fffffffffffffb6c =
           CONCAT13(in_stack_fffffffffffffb86,(int3)in_stack_fffffffffffffb6c);
      if ((in_stack_fffffffffffffb87 & 1) == in_stack_fffffffffffffb86) {
        if ((in_stack_fffffffffffffb87 & 1) == 0) {
          local_438 = 2;
        }
        else {
          bVar3 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffb6c,
                                                    in_stack_fffffffffffffb68));
          if (bVar3) {
            local_1 = 1;
            local_438 = 1;
          }
          else {
            local_438 = 0;
          }
        }
      }
      else {
        local_1 = 1;
        local_438 = 1;
      }
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb88);
      std::__cxx11::string::~string((string *)&local_458);
      if (local_438 != 0) break;
      in_stack_fffffffffffffb68 = 0;
    }
    if (local_438 == 2) {
      local_1 = 0;
      local_438 = 1;
    }
  }
  else {
    local_1 = 1;
    local_438 = 1;
  }
  std::ifstream::~ifstream(local_428);
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool SystemTools::TextFilesDiffer(const std::string& path1,
                                  const std::string& path2)
{
  kwsys::ifstream if1(path1.c_str());
  kwsys::ifstream if2(path2.c_str());
  if (!if1 || !if2) {
    return true;
  }

  for (;;) {
    std::string line1, line2;
    bool hasData1 = GetLineFromStream(if1, line1);
    bool hasData2 = GetLineFromStream(if2, line2);
    if (hasData1 != hasData2) {
      return true;
    }
    if (!hasData1) {
      break;
    }
    if (line1 != line2) {
      return true;
    }
  }
  return false;
}